

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

int __thiscall
kj::anon_unknown_30::SocketAddress::bind
          (SocketAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  Fault f;
  int value;
  Fault local_48;
  undefined4 local_3c;
  String local_38;
  
  if (this->wildcard == true) {
    local_3c = 0;
    do {
      iVar1 = setsockopt(__fd,0x29,0x1a,&local_3c,4);
      if (-1 < iVar1) goto LAB_00320531;
      iVar1 = _::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      local_48.exception = (Exception *)0x0;
      local_38.content.ptr = (char *)0x0;
      local_38.content.size_ = 0;
      _::Debug::Fault::init
                (&local_48,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      _::Debug::Fault::fatal(&local_48);
    }
  }
LAB_00320531:
  do {
    iVar1 = ::bind(__fd,(sockaddr *)&(this->addr).generic,this->addrlen);
    if (-1 < iVar1) {
      return iVar1;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return 0;
  }
  toString(&local_38,this);
  _::Debug::Fault::Fault<int,kj::String>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x231,iVar1,"::bind(sockfd, &addr.generic, addrlen)","toString()",&local_38);
  String::~String(&local_38);
  _::Debug::Fault::fatal(&local_48);
}

Assistant:

void bind(int sockfd) const {
#if !defined(__OpenBSD__)
    if (wildcard) {
      // Disable IPV6_V6ONLY because we want to handle both ipv4 and ipv6 on this socket.  (The
      // default value of this option varies across platforms.)
      int value = 0;
      KJ_SYSCALL(setsockopt(sockfd, IPPROTO_IPV6, IPV6_V6ONLY, &value, sizeof(value)));
    }
#endif

    KJ_SYSCALL(::bind(sockfd, &addr.generic, addrlen), toString());
  }